

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_frontend.cpp
# Opt level: O0

void __thiscall basisu::basisu_frontend::generate_endpoint_clusters(basisu_frontend *this)

{
  uchar uVar1;
  bool bVar2;
  int a;
  uint32_t uVar3;
  uint uVar4;
  uint32_t uVar5;
  size_t sVar6;
  vector<unsigned_int> *pvVar7;
  uchar *puVar8;
  uint *puVar9;
  long in_RDI;
  uint32_t block_index_1;
  uint32_t j_1;
  uint32_t parent_cluster_index_1;
  uint_vec *cluster_1;
  uint32_t cluster_index;
  uint32_t i_1;
  uint32_t block_index;
  uint32_t j;
  uint_vec *cluster;
  uint32_t parent_cluster_index;
  uint32_t i;
  bool status;
  uint32_t max_threads;
  uint32_t parent_codebook_size;
  undefined1 in_stack_0000024b;
  uint32_t in_stack_0000024c;
  vector<basisu::vector<unsigned_int>_> *in_stack_00000250;
  vector<basisu::vector<unsigned_int>_> *in_stack_00000258;
  uint32_t in_stack_00000260;
  uint32_t in_stack_00000264;
  tree_vector_quant<basisu::vec<6U,_float>_> *in_stack_00000268;
  job_pool *in_stack_00000280;
  undefined4 uVar10;
  undefined4 in_stack_ffffffffffffff64;
  uint *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  uint local_64;
  uint local_50;
  uint local_40;
  uint local_3c;
  uint local_34;
  uint local_28;
  uint local_18;
  uint local_10;
  
  debug_printf("Begin endpoint quantization\n");
  if ((*(byte *)(in_RDI + 0x21) & 1) == 0) {
    local_64 = 0;
  }
  else {
    a = std::thread::hardware_concurrency();
    local_64 = minimum<int>(a,8);
  }
  local_10 = local_64;
  if (*(long *)(in_RDI + 0x38) != 0) {
    sVar6 = job_pool::get_total_threads((job_pool *)0x4e09fe);
    local_10 = minimum<int>((int)sVar6,local_64);
  }
  debug_printf("max_threads: %u\n",(ulong)local_10);
  sVar6 = *(size_t *)(in_RDI + 0x38);
  uVar10 = 1;
  bVar2 = generate_hierarchical_codebook_threaded<basisu::tree_vector_quant<basisu::vec<6u,float>>>
                    (in_stack_00000268,in_stack_00000264,in_stack_00000260,in_stack_00000258,
                     in_stack_00000250,in_stack_0000024c,in_stack_00000280,(bool)in_stack_0000024b);
  if (!bVar2) {
    handle_verify_failure(0);
  }
  if ((*(byte *)(in_RDI + 0x49) & 1) != 0) {
    uVar3 = vector<basisu::vector<unsigned_int>_>::size
                      ((vector<basisu::vector<unsigned_int>_> *)(in_RDI + 0xd0));
    if (uVar3 == 0) {
      vector<basisu::vector<unsigned_int>_>::resize
                ((vector<basisu::vector<unsigned_int>_> *)
                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 (size_t)in_stack_ffffffffffffff68,SUB41((uint)in_stack_ffffffffffffff64 >> 0x18,0))
      ;
      vector<basisu::vector<unsigned_int>_>::resize
                ((vector<basisu::vector<unsigned_int>_> *)
                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 (size_t)in_stack_ffffffffffffff68,SUB41((uint)in_stack_ffffffffffffff64 >> 0x18,0))
      ;
      for (local_18 = 0; local_18 < *(uint *)(in_RDI + 0x40); local_18 = local_18 + 1) {
        vector<basisu::vector<unsigned_int>_>::operator[]
                  ((vector<basisu::vector<unsigned_int>_> *)
                   CONCAT44(in_stack_ffffffffffffff64,uVar10),sVar6);
        vector<unsigned_int>::push_back
                  ((vector<unsigned_int> *)
                   CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                   in_stack_ffffffffffffff68);
        vector<basisu::vector<unsigned_int>_>::operator[]
                  ((vector<basisu::vector<unsigned_int>_> *)
                   CONCAT44(in_stack_ffffffffffffff64,uVar10),sVar6);
        vector<unsigned_int>::push_back
                  ((vector<unsigned_int> *)
                   CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                   in_stack_ffffffffffffff68);
      }
    }
    vector<unsigned_char>::resize
              ((vector<unsigned_char> *)
               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               (size_t)in_stack_ffffffffffffff68,SUB41((uint)in_stack_ffffffffffffff64 >> 0x18,0));
    vector<unsigned_char>::resize
              ((vector<unsigned_char> *)
               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               (size_t)in_stack_ffffffffffffff68,SUB41((uint)in_stack_ffffffffffffff64 >> 0x18,0));
    vector_set_all<basisu::vector<unsigned_char>>
              ((vector<unsigned_char> *)
               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               (value_type_conflict3 *)in_stack_ffffffffffffff68);
    for (local_28 = 0;
        uVar3 = vector<basisu::vector<unsigned_int>_>::size
                          ((vector<basisu::vector<unsigned_int>_> *)(in_RDI + 0xd0)),
        local_28 < uVar3; local_28 = local_28 + 1) {
      pvVar7 = vector<basisu::vector<unsigned_int>_>::operator[]
                         ((vector<basisu::vector<unsigned_int>_> *)
                          CONCAT44(in_stack_ffffffffffffff64,uVar10),sVar6);
      for (local_34 = 0; uVar3 = vector<unsigned_int>::size(pvVar7), local_34 < uVar3;
          local_34 = local_34 + 1) {
        vector<unsigned_int>::operator[]
                  ((vector<unsigned_int> *)CONCAT44(in_stack_ffffffffffffff64,uVar10),sVar6);
        puVar8 = vector<unsigned_char>::operator[]
                           ((vector<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff64,uVar10),
                            sVar6);
        *puVar8 = (uchar)local_28;
      }
    }
    for (local_3c = 0; local_3c < *(uint *)(in_RDI + 0x40); local_3c = local_3c + 1) {
      puVar8 = vector<unsigned_char>::operator[]
                         ((vector<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff64,uVar10),sVar6)
      ;
      if (*puVar8 == 0xff) {
        handle_verify_failure(0);
      }
    }
    for (local_40 = 0;
        uVar3 = vector<basisu::vector<unsigned_int>_>::size
                          ((vector<basisu::vector<unsigned_int>_> *)(in_RDI + 0xc0)),
        local_40 < uVar3; local_40 = local_40 + 1) {
      pvVar7 = vector<basisu::vector<unsigned_int>_>::operator[]
                         ((vector<basisu::vector<unsigned_int>_> *)
                          CONCAT44(in_stack_ffffffffffffff64,uVar10),sVar6);
      uVar1 = '\0';
      for (local_50 = 0; uVar3 = vector<unsigned_int>::size(pvVar7), local_50 < uVar3;
          local_50 = local_50 + 1) {
        puVar9 = vector<unsigned_int>::operator[]
                           ((vector<unsigned_int> *)CONCAT44(in_stack_ffffffffffffff64,uVar10),sVar6
                           );
        uVar4 = *puVar9 >> 1;
        uVar3 = vector<unsigned_char>::size((vector<unsigned_char> *)(in_RDI + 0xe0));
        if (uVar3 <= uVar4) {
          handle_verify_failure(0);
        }
        if (local_50 == 0) {
          puVar8 = vector<unsigned_char>::operator[]
                             ((vector<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff64,uVar10),
                              sVar6);
          uVar1 = *puVar8;
        }
        else {
          puVar8 = vector<unsigned_char>::operator[]
                             ((vector<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff64,uVar10),
                              sVar6);
          if (*puVar8 != uVar1) {
            handle_verify_failure(0);
          }
        }
      }
    }
  }
  if ((*(byte *)(in_RDI + 0x1d) & 1) != 0) {
    uVar3 = vector<basisu::vector<unsigned_int>_>::size
                      ((vector<basisu::vector<unsigned_int>_> *)(in_RDI + 0xc0));
    uVar5 = vector<basisu::vector<unsigned_int>_>::size
                      ((vector<basisu::vector<unsigned_int>_> *)(in_RDI + 0xd0));
    debug_printf("Total endpoint clusters: %u, parent clusters: %u\n",(ulong)uVar3,(ulong)uVar5);
  }
  return;
}

Assistant:

void basisu_frontend::generate_endpoint_clusters()
	{
		debug_printf("Begin endpoint quantization\n");

		const uint32_t parent_codebook_size = (m_params.m_max_endpoint_clusters >= 256) ? BASISU_ENDPOINT_PARENT_CODEBOOK_SIZE : 0;
		uint32_t max_threads = 0;
		max_threads = m_params.m_multithreaded ? minimum<int>(std::thread::hardware_concurrency(), cMaxCodebookCreationThreads) : 0;
		if (m_params.m_pJob_pool)
			max_threads = minimum<int>((int)m_params.m_pJob_pool->get_total_threads(), max_threads);

		debug_printf("max_threads: %u\n", max_threads);
		bool status = generate_hierarchical_codebook_threaded(m_endpoint_clusterizer,
			m_params.m_max_endpoint_clusters, m_use_hierarchical_endpoint_codebooks ? parent_codebook_size : 0,
			m_endpoint_clusters,
			m_endpoint_parent_clusters,
			max_threads, m_params.m_pJob_pool, true);
		BASISU_FRONTEND_VERIFY(status);

		if (m_use_hierarchical_endpoint_codebooks)
		{
			if (!m_endpoint_parent_clusters.size())
			{
				m_endpoint_parent_clusters.resize(0);
				m_endpoint_parent_clusters.resize(1);
				for (uint32_t i = 0; i < m_total_blocks; i++)
				{
					m_endpoint_parent_clusters[0].push_back(i*2);
					m_endpoint_parent_clusters[0].push_back(i*2+1);
				}
			}

			BASISU_ASSUME(BASISU_ENDPOINT_PARENT_CODEBOOK_SIZE <= UINT8_MAX);

			m_block_parent_endpoint_cluster.resize(0);
			m_block_parent_endpoint_cluster.resize(m_total_blocks);
			vector_set_all(m_block_parent_endpoint_cluster, 0xFF);
			for (uint32_t parent_cluster_index = 0; parent_cluster_index < m_endpoint_parent_clusters.size(); parent_cluster_index++)
			{
				const uint_vec &cluster = m_endpoint_parent_clusters[parent_cluster_index];
				for (uint32_t j = 0; j < cluster.size(); j++)
				{
					const uint32_t block_index = cluster[j] >> 1;
					m_block_parent_endpoint_cluster[block_index] = static_cast<uint8_t>(parent_cluster_index);
				}
			}

			for (uint32_t i = 0; i < m_total_blocks; i++)
			{
				BASISU_FRONTEND_VERIFY(m_block_parent_endpoint_cluster[i] != 0xFF);
			}

			// Ensure that all the blocks within each cluster are all in the same parent cluster, or something is very wrong.
			for (uint32_t cluster_index = 0; cluster_index < m_endpoint_clusters.size(); cluster_index++)
			{
				const uint_vec &cluster = m_endpoint_clusters[cluster_index];
			
				uint32_t parent_cluster_index = 0;
				for (uint32_t j = 0; j < cluster.size(); j++)
				{
					const uint32_t block_index = cluster[j] >> 1;
					
					BASISU_FRONTEND_VERIFY(block_index < m_block_parent_endpoint_cluster.size());

					if (!j)
					{
						parent_cluster_index = m_block_parent_endpoint_cluster[block_index];
					}
					else
					{
						BASISU_FRONTEND_VERIFY(m_block_parent_endpoint_cluster[block_index] == parent_cluster_index);
					}
				}
			}
		}
								
		if (m_params.m_debug_stats)
			debug_printf("Total endpoint clusters: %u, parent clusters: %u\n", (uint32_t)m_endpoint_clusters.size(), (uint32_t)m_endpoint_parent_clusters.size());
	}